

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall
wabt::TypeChecker::CheckReturnSignature
          (TypeChecker *this,TypeVector *actual,TypeVector *expected,char *desc)

{
  _Alloc_hider _Var1;
  Result RVar2;
  string local_68;
  string local_48;
  
  RVar2 = CheckTypes(this,actual,expected);
  if (RVar2.enum_ == Error) {
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)expected,(TypeVector *)0x0,desc);
    _Var1._M_p = local_48._M_dataplus._M_p;
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)actual,(TypeVector *)0x0,desc);
    PrintError(this,"return signatures have inconsistent types: expected %s, got %s",_Var1._M_p,
               local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result TypeChecker::CheckReturnSignature(const TypeVector& actual,
                                         const TypeVector& expected,
                                         const char* desc) {
  Result result = CheckTypes(actual, expected);
  if (Failed(result)) {
    PrintError("return signatures have inconsistent types: expected %s, got %s",
               TypesToString(expected).c_str(), TypesToString(actual).c_str());
  }
  return result;
}